

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O2

bool CheckRTL8211F_RegIO(AmpIO *Board,uint chan,uint phyAddr)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  char *pcVar4;
  uint16_t mask;
  ushort data;
  uint16_t curPage;
  uint16_t mask_read;
  uint16_t curIner;
  undefined4 local_34;
  
  bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,&curPage);
  if (bVar1) {
    if (curPage != 0xa42) {
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar3 = std::operator<<((ostream *)&std::cout,"Changing page from ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,curPage);
      poVar3 = std::operator<<(poVar3," to ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xa42);
      std::endl<char,std::char_traits<char>>(poVar3);
      bVar1 = FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,0xa42);
      if (!bVar1) {
        pcVar4 = "Failed to write PHY";
        goto LAB_00105661;
      }
    }
    bVar1 = FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,&curIner);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Testing RTL8211F PHY");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," Register I/O, initial value = ");
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,curIner);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      local_34 = (undefined4)CONCAT71((int7)((ulong)poVar3 >> 8),1);
      for (data = 1; data != 0; data = data * 2) {
        FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,data);
        FpgaIO::ReadRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,&mask_read);
        if (data != mask_read) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Error: wrote ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,data);
          poVar3 = std::operator<<(poVar3,", read ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,mask_read);
          std::endl<char,std::char_traits<char>>(poVar3);
          local_34 = 0;
        }
      }
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      poVar3 = std::operator<<((ostream *)&std::cout,"Test complete");
      std::endl<char,std::char_traits<char>>(poVar3);
      FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x12,curIner);
      FpgaIO::WriteRTL8211F_Register(&Board->super_FpgaIO,chan,phyAddr,0x1f,curPage);
      bVar2 = (byte)local_34;
      goto LAB_001056a9;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to read PHY");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = " INER";
  }
  else {
    pcVar4 = "Failed to read PHY";
LAB_00105661:
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar4);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = " PAGSR";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  bVar2 = 0;
LAB_001056a9:
  return (bool)(bVar2 & 1);
}

Assistant:

bool CheckRTL8211F_RegIO(AmpIO &Board, unsigned int chan, unsigned int phyAddr)
{
    uint16_t curPage;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage)) {
        std::cout << "Failed to read PHY" << chan << " PAGSR" << std::endl;
        return false;
    }
    if (curPage != FpgaIO::RTL8211F_PAGE_DEFAULT) {
        std::cout << std::hex << "Changing page from " << curPage << " to " << FpgaIO::RTL8211F_PAGE_DEFAULT << std::endl;
        if (!Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, FpgaIO::RTL8211F_PAGE_DEFAULT)) {
            std::cout << "Failed to write PHY" << chan << " PAGSR" << std::endl;
            return false;
        }
    }
    // Perform walking bit test on INER (interrupt enable register, 18)
    uint16_t curIner, mask_read;
    if (!Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner)) {
        std::cout << "Failed to read PHY" << chan << " INER" << std::endl;
        return false;
    }
    std::cout << "Testing RTL8211F PHY" << chan << " Register I/O, initial value = " << std::hex << curIner << std::endl;
    bool allOK = true;
    for (uint16_t mask = 0x1; mask != 0; mask <<= 1) {
        Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask);
        Board.ReadRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, mask_read);
        if (mask != mask_read) {
            std::cout << "Error: wrote " << mask << ", read " << mask_read << std::endl;
            allOK = false;
            //break;
        }
    }
    std::cout << std::dec << "Test complete" << std::endl;
    // Restore original values
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_INER, curIner);
    Board.WriteRTL8211F_Register(chan, phyAddr, FpgaIO::RTL8211F_PAGSR, curPage);
    return allOK;
}